

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigenval.c
# Opt level: O1

size_t NoSmallerEigenvals(size_t n,double *Alpha,double *Beta,double Lambda)

{
  size_t sVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = (Alpha[1] - Lambda) / ABS(Beta[1]);
  sVar1 = (size_t)(-(uint)(ABS(dVar3) < 2.2250738585072014e-307 || dVar3 < 0.0) & 1);
  if (1 < n) {
    uVar2 = 2;
    dVar5 = 1.0;
    do {
      dVar4 = dVar3;
      dVar3 = Beta[uVar2 - 1];
      dVar3 = ((Alpha[uVar2] - Lambda) * dVar4 - (dVar3 / ABS(dVar3)) * dVar3 * dVar5) /
              ABS(Beta[uVar2]);
      if ((dVar4 * dVar3 < 0.0) ||
         ((ABS(dVar3) < 2.2250738585072014e-307 && (2.2250738585072014e-307 <= ABS(dVar4))))) {
        sVar1 = sVar1 + 1;
      }
      uVar2 = uVar2 + 1;
      dVar5 = dVar4;
    } while (uVar2 <= n);
  }
  return sVar1;
}

Assistant:

static size_t NoSmallerEigenvals(size_t n, double *Alpha, double *Beta, double Lambda)
/* returns number of eigenvalues of the tridiagonal matrix
   (Beta[i-1] Alpha[i] Beta[i]) (where 1 <= i <= n) 
   which are less then Lambda */
{
    size_t No;
    
    double p, pNew, pOld, Sign;
    size_t i;
    
    No = 0;
    
    pOld = 1.0;
    p = (Alpha[1] - Lambda) / fabs(Beta[1]);
    /* check for change of sign */
    if (IsZero(p) || p * pOld < 0)
        No++;
    
    for (i = 2; i <= n; i++) {
        Sign = Beta[i-1] / fabs(Beta[i-1]);
        pNew = ((Alpha[i] - Lambda) * p - Beta[i-1] * Sign * pOld) / fabs(Beta[i]);
        pOld = p;
        p = pNew;
	
	/* check for change of sign */
	if (p * pOld < 0 || (IsZero(p) && !IsZero(pOld)))
	    No++;
    }
   
    return(No);
}